

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O2

void __thiscall QStringMatcher::setPattern(QStringMatcher *this,QString *pattern)

{
  char16_t *pcVar1;
  
  QArrayDataPointer<char16_t>::operator=(&(this->q_pattern).d,&pattern->d);
  pcVar1 = (this->q_pattern).d.ptr;
  (this->q_sv).m_size = (this->q_pattern).d.size;
  (this->q_sv).m_data = pcVar1;
  updateSkipTable(this);
  return;
}

Assistant:

void QStringMatcher::setPattern(const QString &pattern)
{
    q_pattern = pattern;
    q_sv = q_pattern;
    updateSkipTable();
}